

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_data qpdf_init(void)

{
  _qpdf_data *this;
  shared_ptr<QPDF> local_20;
  _qpdf_data *local_10;
  _qpdf_data *qpdf;
  
  QTC::TC("qpdf","qpdf-c called qpdf_init",0);
  this = (_qpdf_data *)operator_new(0x148);
  memset(this,0,0x148);
  _qpdf_data::_qpdf_data(this);
  local_10 = this;
  QPDF::create();
  std::shared_ptr<QPDF>::operator=(&local_10->qpdf,&local_20);
  std::shared_ptr<QPDF>::~shared_ptr(&local_20);
  return local_10;
}

Assistant:

qpdf_data
qpdf_init()
{
    QTC::TC("qpdf", "qpdf-c called qpdf_init");
    auto qpdf = new _qpdf_data();
    qpdf->qpdf = QPDF::create();
    return qpdf;
}